

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptUtils.cpp
# Opt level: O1

void setIntVariable(Variable *variable,int value)

{
  Object *pOVar1;
  int iVar2;
  long lVar3;
  runtime_error *this;
  
  if (variable == (Variable *)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"ScriptUtils::setIntVariable => variable is null!");
  }
  else {
    pOVar1 = variable->value;
    iVar2 = (**pOVar1->_vptr_Object)(pOVar1);
    if ((char)iVar2 == '\0') {
      lVar3 = __dynamic_cast(pOVar1,&Object::typeinfo,&ObjectInt::typeinfo,0);
      *(int *)(lVar3 + 8) = value;
      return;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"ScriptUtils::setIntVariable => wrong type!");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void setIntVariable(Variable* variable, int value) {
	if (variable == nullptr) {
		throw std::runtime_error("ScriptUtils::setIntVariable => variable is null!");
	}
	Object* object = variable->value;
	ObjectType type = object->getType();
	if (type == OT_INT) {
		auto *objectInt = dynamic_cast<ObjectInt *>(object);
		objectInt->value = value;
	} else {
		throw std::runtime_error("ScriptUtils::setIntVariable => wrong type!");
	}
}